

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_resting_step_turn(player *p)

{
  player *p_local;
  
  if (L'\0' < p->upkeep->resting) {
    p->upkeep->resting = p->upkeep->resting + L'\xffffffff';
    p->upkeep->redraw = p->upkeep->redraw | 0x8000;
  }
  p->upkeep->energy_use = (uint)z_info->move_energy;
  p->resting_turn = p->resting_turn + 1;
  player_turns_rested = player_turns_rested + L'\x01';
  return;
}

Assistant:

void player_resting_step_turn(struct player *p)
{
	/* Timed rest */
	if (p->upkeep->resting > 0) {
		/* Reduce rest count */
		p->upkeep->resting--;

		/* Redraw the state */
		p->upkeep->redraw |= (PR_STATE);
	}

	/* Take a turn */
	p->upkeep->energy_use = z_info->move_energy;

	/* Increment the resting counters */
	p->resting_turn++;
	player_turns_rested++;
}